

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__extend_receive(stbi__jpeg *j,int n)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int in_ESI;
  long in_RDI;
  int sgn;
  uint k;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  if (*(int *)(in_RDI + 0x4824) < in_ESI) {
    stbi__grow_buffer_unsafe
              ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  iVar1 = *(int *)(in_RDI + 0x4820);
  uVar3 = *(int *)(in_RDI + 0x4820) << ((byte)in_ESI & 0x1f) |
          *(uint *)(in_RDI + 0x4820) >> (0x20 - (byte)in_ESI & 0x1f);
  if ((in_ESI < 0) || (0x10 < in_ESI)) {
    local_4 = 0;
  }
  else {
    *(uint *)(in_RDI + 0x4820) = uVar3 & (stbi__bmask[in_ESI] ^ 0xffffffff);
    uVar2 = stbi__bmask[in_ESI];
    *(int *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) - in_ESI;
    local_4 = (uVar2 & uVar3) + (stbi__jbias[in_ESI] & (iVar1 >> 0x1f ^ 0xffffffffU));
  }
  return local_4;
}

Assistant:

stbi_inline static int stbi__extend_receive(stbi__jpeg *j, int n)
{
   unsigned int k;
   int sgn;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);

   sgn = (stbi__int32)j->code_buffer >> 31; // sign bit is always in MSB
   k = stbi_lrot(j->code_buffer, n);
   if (n < 0 || n >= (int) (sizeof(stbi__bmask)/sizeof(*stbi__bmask))) return 0;
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k + (stbi__jbias[n] & ~sgn);
}